

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O0

void __thiscall
slang::syntax::SpecifyBlockSyntax::SpecifyBlockSyntax
          (SpecifyBlockSyntax *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes,
          Token specify,SyntaxList<slang::syntax::MemberSyntax> *items,Token endspecify)

{
  Token TVar1;
  iterator ppMVar2;
  undefined8 uVar3;
  MemberSyntax *child;
  iterator __end2;
  iterator __begin2;
  SyntaxList<slang::syntax::MemberSyntax> *__range2;
  SyntaxList<slang::syntax::MemberSyntax> *items_local;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes_local;
  SpecifyBlockSyntax *this_local;
  Token specify_local;
  
  TVar1 = endspecify;
  uVar3 = specify._0_8_;
  MemberSyntax::MemberSyntax(&this->super_MemberSyntax,SpecifyBlock,attributes);
  (this->specify).kind = (short)uVar3;
  (this->specify).field_0x2 = (char)((ulong)uVar3 >> 0x10);
  (this->specify).numFlags = (NumericTokenFlags)(char)((ulong)uVar3 >> 0x18);
  (this->specify).rawLen = (int)((ulong)uVar3 >> 0x20);
  (this->specify).info = specify.info;
  SyntaxList<slang::syntax::MemberSyntax>::SyntaxList(&this->items,items);
  (this->endspecify).kind = endspecify.kind;
  (this->endspecify).field_0x2 = endspecify._2_1_;
  (this->endspecify).numFlags = (NumericTokenFlags)endspecify.numFlags.raw;
  (this->endspecify).rawLen = endspecify.rawLen;
  endspecify.info = TVar1.info;
  (this->endspecify).info = endspecify.info;
  (this->items).super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)this;
  __end2 = nonstd::span_lite::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>::begin
                     (&(this->items).
                       super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>);
  ppMVar2 = nonstd::span_lite::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>::end
                      (&(this->items).
                        super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>);
  for (; __end2 != ppMVar2; __end2 = __end2 + 1) {
    ((*__end2)->super_SyntaxNode).parent = (SyntaxNode *)this;
  }
  return;
}

Assistant:

SpecifyBlockSyntax(const SyntaxList<AttributeInstanceSyntax>& attributes, Token specify, const SyntaxList<MemberSyntax>& items, Token endspecify) :
        MemberSyntax(SyntaxKind::SpecifyBlock, attributes), specify(specify), items(items), endspecify(endspecify) {
        this->items.parent = this;
        for (auto child : this->items)
            child->parent = this;
    }